

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MarketDataRequest.h
# Opt level: O2

void __thiscall FIX42::MarketDataRequest::NoRelatedSym::NoRelatedSym(NoRelatedSym *this)

{
  message_order local_38 [8];
  shared_array<int> local_30 [24];
  
  FIX::message_order::message_order
            (local_38,0x37,0x41,0x30,0x16,0xa7,200,0xcd,0xc9,0xca,0xce,0xe7,0xdf,0xcf,0x6a,0x15c,
             0x15d,0x6b,0x15e,0x15f,0x150,0);
  FIX::Group::Group(&this->super_Group,0x92,0x37,local_38);
  FIX::shared_array<int>::~shared_array(local_30);
  *(undefined ***)&this->super_Group = &PTR__FieldMap_00151048;
  return;
}

Assistant:

NoRelatedSym() : FIX::Group(146,55,FIX::message_order(55,65,48,22,167,200,205,201,202,206,231,223,207,106,348,349,107,350,351,336,0)) {}